

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O0

void Am_Inter_Call_Method
               (Am_Object *inter_or_cmd,Am_Slot_Key method_slot,int x,int y,Am_Object *ref_obj,
               Am_Input_Char *ic,Am_Object *object_modified,Am_Inter_Location *points)

{
  bool bVar1;
  uint uVar2;
  Am_Value *in_value;
  Am_Method_Wrapper *wrapper_00;
  Am_Inter_Location local_c8;
  Am_Object local_c0;
  Am_Object local_b8;
  undefined1 local_b0 [8];
  Am_Current_Location_Method method_2;
  Am_Object local_98;
  Am_Object local_90;
  undefined1 local_88 [8];
  Am_Mouse_Event_Method method_1;
  undefined1 local_70 [8];
  Am_Object_Method method;
  Am_ID_Tag id;
  Am_Method_Wrapper *wrapper;
  undefined1 local_40 [8];
  Am_Value method_value;
  Am_Input_Char *ic_local;
  Am_Object *ref_obj_local;
  int y_local;
  int x_local;
  Am_Slot_Key method_slot_local;
  Am_Object *inter_or_cmd_local;
  
  method_value.value = (anon_union_8_8_ea4c8939_for_value)ic;
  bVar1 = Am_Object::Valid(inter_or_cmd);
  if (bVar1) {
    Am_Value::Am_Value((Am_Value *)local_40);
    in_value = Am_Object::Peek(inter_or_cmd,method_slot,0);
    Am_Value::operator=((Am_Value *)local_40,in_value);
    bVar1 = Am_Value::Valid((Am_Value *)local_40);
    if (bVar1) {
      wrapper_00 = Am_Value::operator_cast_to_Am_Method_Wrapper_((Am_Value *)local_40);
      uVar2 = (**(wrapper_00->super_Am_Registered_Type)._vptr_Am_Registered_Type)();
      method.Call._6_2_ = (undefined2)uVar2;
      if ((uVar2 & 0xffff) == (uint)Am_Object_Method::Am_Object_Method_ID) {
        Am_Object_Method::Am_Object_Method((Am_Object_Method *)local_70);
        Am_Object_Method::operator=((Am_Object_Method *)local_70,wrapper_00);
        bVar1 = Am_Object_Method::Valid((Am_Object_Method *)local_70);
        if (bVar1) {
          Am_Object::Am_Object((Am_Object *)&method_1.Call,inter_or_cmd);
          (*(code *)method.from_wrapper)(&method_1.Call);
          Am_Object::~Am_Object((Am_Object *)&method_1.Call);
        }
      }
      else if ((uVar2 & 0xffff) == (uint)Am_Mouse_Event_Method::Am_Mouse_Event_Method_ID) {
        Am_Mouse_Event_Method::Am_Mouse_Event_Method((Am_Mouse_Event_Method *)local_88);
        Am_Mouse_Event_Method::operator=((Am_Mouse_Event_Method *)local_88,wrapper_00);
        bVar1 = Am_Mouse_Event_Method::Valid((Am_Mouse_Event_Method *)local_88);
        if (bVar1) {
          Am_Object::Am_Object(&local_90,inter_or_cmd);
          Am_Object::Am_Object(&local_98,ref_obj);
          method_2.Call._4_4_ =
               *(undefined4 *)
                &((method_value.value.wrapper_value)->super_Am_Registered_Type).
                 _vptr_Am_Registered_Type;
          (*(code *)method_1.from_wrapper)(&local_90,x,y,&local_98,method_2.Call._4_4_);
          Am_Object::~Am_Object(&local_98);
          Am_Object::~Am_Object(&local_90);
        }
      }
      else if ((uVar2 & 0xffff) == (uint)Am_Current_Location_Method::Am_Current_Location_Method_ID)
      {
        bVar1 = Am_Inter_Location::Valid(points);
        if (!bVar1) {
          Am_Error("Method of type Current_Location_Method but no data points",inter_or_cmd,
                   method_slot);
        }
        Am_Current_Location_Method::Am_Current_Location_Method
                  ((Am_Current_Location_Method *)local_b0);
        Am_Current_Location_Method::operator=((Am_Current_Location_Method *)local_b0,wrapper_00);
        bVar1 = Am_Current_Location_Method::Valid((Am_Current_Location_Method *)local_b0);
        if (bVar1) {
          Am_Object::Am_Object(&local_b8,inter_or_cmd);
          Am_Object::Am_Object(&local_c0,object_modified);
          Am_Inter_Location::Am_Inter_Location(&local_c8,points);
          (*(code *)method_2.from_wrapper)(&local_b8,&local_c0,&local_c8);
          Am_Inter_Location::~Am_Inter_Location(&local_c8);
          Am_Object::~Am_Object(&local_c0);
          Am_Object::~Am_Object(&local_b8);
        }
      }
      else {
        Am_Error("Wrong type method: can only accept methods of types Am_Object_Method, Am_Mouse_Event_Method, or Am_Current_Location_Method."
                 ,inter_or_cmd,method_slot);
      }
    }
    Am_Value::~Am_Value((Am_Value *)local_40);
  }
  return;
}

Assistant:

void
Am_Inter_Call_Method(Am_Object &inter_or_cmd, Am_Slot_Key method_slot, int x,
                     int y, Am_Object &ref_obj, Am_Input_Char &ic,
                     Am_Object &object_modified, Am_Inter_Location &points)
{
  //be careful that have object and it has the slot and the slot has a method
  if (inter_or_cmd.Valid()) {
    Am_Value method_value;
    method_value = inter_or_cmd.Peek(method_slot);
    if (method_value.Valid()) {
      Am_Method_Wrapper *wrapper;
      wrapper = method_value;
      Am_INTER_TRACE_PRINT_NOENDL(
          inter_or_cmd, "%%Executing " << Am_Get_Slot_Name(method_slot)
                                       << " of " << inter_or_cmd << "=");
      Am_ID_Tag id = wrapper->ID();
      if (id == Am_Object_Method::Am_Object_Method_ID) {
        Am_Object_Method method;
        method = wrapper;
        Am_INTER_TRACE_PRINT(inter_or_cmd, method);
        if (method.Valid())
          method.Call(inter_or_cmd);
      } else if (id == Am_Mouse_Event_Method::Am_Mouse_Event_Method_ID) {
        Am_Mouse_Event_Method method;
        method = wrapper;
        Am_INTER_TRACE_PRINT(inter_or_cmd, method);
        if (method.Valid())
          method.Call(inter_or_cmd, x, y, ref_obj, ic);
      } else if (id ==
                 Am_Current_Location_Method::Am_Current_Location_Method_ID) {
        if (!points.Valid())
          Am_Error("Method of type Current_Location_Method but no data points",
                   inter_or_cmd, method_slot);
        Am_Current_Location_Method method;
        method = wrapper;
        Am_INTER_TRACE_PRINT(inter_or_cmd, method);
        if (method.Valid())
          method.Call(inter_or_cmd, object_modified, points);
      } else
        Am_Error("Wrong type method: can only accept methods of types "
                 "Am_Object_Method, Am_Mouse_Event_Method, or "
                 "Am_Current_Location_Method.",
                 inter_or_cmd, method_slot);
    }
  }
}